

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

int Nwk_ManVerifyLevel(Nwk_Man_t *pNtk)

{
  Nwk_Obj_t *pObj;
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    uVar3 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar2->pArray[uVar3];
      if (pObj != (Nwk_Obj_t *)0x0) {
        if ((pObj->field_0x20 & 0x10) != 0) {
          __assert_fail("pObj->MarkA == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                        ,0x346,"int Nwk_ManVerifyLevel(Nwk_Man_t *)");
        }
        uVar1 = Nwk_ObjLevelNew(pObj);
        if (pObj->Level != uVar1) {
          printf("Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n",
                 uVar3 & 0xffffffff,(ulong)(uint)pObj->Level,(ulong)uVar1);
        }
      }
      uVar3 = uVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while ((long)uVar3 < (long)pVVar2->nSize);
  }
  return 1;
}

Assistant:

int Nwk_ManVerifyLevel( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int LevelNew, i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        LevelNew = Nwk_ObjLevelNew( pObj );
        if ( Nwk_ObjLevel(pObj) != LevelNew )
        {
            printf( "Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n", 
                i, Nwk_ObjLevel(pObj), LevelNew );
        }
    }
    return 1;
}